

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_crg(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_crg_t *crg;
  jpc_dec_cmpt_t *cmpt;
  int cmptno;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  for (cmpt._4_4_ = 0; cmpt._4_4_ < dec->numcomps; cmpt._4_4_ = cmpt._4_4_ + 1) {
  }
  return 0;
}

Assistant:

static int jpc_dec_process_crg(jpc_dec_t *dec, jpc_ms_t *ms)
{
	int cmptno;
	jpc_dec_cmpt_t *cmpt;
	jpc_crg_t *crg;

	crg = &ms->parms.crg;
	for (cmptno = 0, cmpt = dec->cmpts; cmptno < dec->numcomps; ++cmptno,
	  ++cmpt) {
		/* Ignore the information in the CRG marker segment for now.
		  This information serves no useful purpose for decoding anyhow.
		  Some other parts of the code need to be changed if these lines
		  are uncommented.
		cmpt->hsubstep = crg->comps[cmptno].hoff;
		cmpt->vsubstep = crg->comps[cmptno].voff;
		*/
		/* suppress -Wunused-but-set-variable */
		(void)crg;
	}
	return 0;
}